

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void la_func_end(TCGContext_conflict9 *s,int ng,int nt)

{
  ulong uVar1;
  TCGTemp *pTVar2;
  long lVar3;
  bool bVar4;
  
  pTVar2 = s->temps;
  uVar1 = 0;
  if (0 < ng) {
    uVar1 = (ulong)(uint)ng;
  }
  while (bVar4 = uVar1 != 0, uVar1 = uVar1 - 1, bVar4) {
    pTVar2->state = 3;
    la_reset_pref(s,pTVar2);
    pTVar2 = pTVar2 + 1;
  }
  lVar3 = (long)ng;
  pTVar2 = s->temps + lVar3;
  for (; lVar3 < nt; lVar3 = lVar3 + 1) {
    pTVar2->state = 1;
    la_reset_pref(s,pTVar2);
    pTVar2 = pTVar2 + 1;
  }
  return;
}

Assistant:

static void la_func_end(TCGContext *s, int ng, int nt)
{
    int i;

    for (i = 0; i < ng; ++i) {
        s->temps[i].state = TS_DEAD | TS_MEM;
        la_reset_pref(s, &s->temps[i]);
    }
    for (i = ng; i < nt; ++i) {
        s->temps[i].state = TS_DEAD;
        la_reset_pref(s, &s->temps[i]);
    }
}